

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O0

int KINBBDPrecGetNumGfnEvals(void *kinmem,long *ngevalsBBDP)

{
  KBBDPrecData pdata;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  long *ngevalsBBDP_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINBBDPRE","KINBBDPrecGetNumGfnEvals","KINSOL Memory is NULL.");
    kinmem_local._4_4_ = -1;
  }
  else if (*(long *)((long)kinmem + 0x1f8) == 0) {
    KINProcessError((KINMem)kinmem,-2,"KINBBDPRE","KINBBDPrecGetNumGfnEvals",
                    "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                   );
    kinmem_local._4_4_ = -2;
  }
  else if (*(long *)(*(long *)((long)kinmem + 0x1f8) + 0x90) == 0) {
    KINProcessError((KINMem)kinmem,-5,"KINBBDPRE","KINBBDPrecGetNumGfnEvals",
                    "BBD peconditioner memory is NULL. IDABBDPrecInit must be called.");
    kinmem_local._4_4_ = -5;
  }
  else {
    *ngevalsBBDP = *(long *)(*(long *)(*(long *)((long)kinmem + 0x1f8) + 0x90) + 0x88);
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINBBDPrecGetNumGfnEvals(void *kinmem,
                             long int *ngevalsBBDP)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;

  if (kinmem == NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINBBDPRE",
                    "KINBBDPrecGetNumGfnEvals", MSGBBD_MEM_NULL);
    return(KINLS_MEM_NULL);
  }
  kin_mem = (KINMem) kinmem;

  if (kin_mem->kin_lmem == NULL) {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, "KINBBDPRE",
                    "KINBBDPrecGetNumGfnEvals", MSGBBD_LMEM_NULL);
    return(KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem) kin_mem->kin_lmem;

  if (kinls_mem->pdata == NULL) {
    KINProcessError(kin_mem, KINLS_PMEM_NULL, "KINBBDPRE",
                    "KINBBDPrecGetNumGfnEvals", MSGBBD_PMEM_NULL);
    return(KINLS_PMEM_NULL);
  } 
  pdata = (KBBDPrecData) kinls_mem->pdata;

  *ngevalsBBDP = pdata->nge;

  return(KINLS_SUCCESS);
}